

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::invite_srv_to_join_cluster(raft_server *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  unsigned_long *args_6;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  element_type *this_00;
  element_type *peVar6;
  string *psVar7;
  undefined8 uVar8;
  long in_RDI;
  rpc_handler *in_stack_00000068;
  ptr<req_msg> *in_stack_00000070;
  ptr<peer> *in_stack_00000078;
  peer *in_stack_00000080;
  ptr<cluster_config> c_conf;
  ptr<req_msg> req;
  memory_order __b;
  value_type *__x;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *this_01;
  unsigned_long *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  msg_type *in_stack_fffffffffffffee0;
  unsigned_long *in_stack_fffffffffffffee8;
  unsigned_long *in_stack_ffffffffffffff00;
  string local_d8 [48];
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_58 [16];
  pointer local_48;
  int32 local_40;
  undefined4 local_3c;
  ulong local_38;
  pointer local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x274f28);
  local_38 = srv_state::get_term((srv_state *)0x274f30);
  local_3c = 0xc;
  args_6 = (unsigned_long *)(in_RDI + 0x38);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x274f60
            );
  local_40 = peer::get_id((peer *)0x274f68);
  local_48 = (pointer)0x0;
  peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x274f8c);
  iVar2 = (*peVar4->_vptr_log_store[2])();
  local_58._8_8_ = CONCAT44(extraout_var,iVar2) + -1;
  puVar5 = (undefined8 *)(in_RDI + 0xa0);
  local_c = 5;
  local_8 = puVar5;
  local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_18 = (pointer)*puVar5;
  }
  else if (local_c == 5) {
    local_18 = (pointer)*puVar5;
  }
  else {
    local_18 = (pointer)*puVar5;
  }
  local_58._0_8_ = local_18;
  this_01 = (vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             *)local_58;
  __x = (value_type *)(local_58 + 8);
  cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,long,unsigned_long,unsigned_long>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             (int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8,in_stack_ffffffffffffff00,
             args_6);
  get_config((raft_server *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2750b9);
  req_msg::log_entries(this_00);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2750d9);
  srv_state::get_term((srv_state *)0x2750e1);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x275102);
  cluster_config::serialize
            ((cluster_config *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
            (in_stack_fffffffffffffec8,(shared_ptr<nuraft::buffer> *)this_01,(log_val_type *)__x);
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  push_back(this_01,__x);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x275164);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x275171);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x275187
            );
  std::shared_ptr<nuraft::peer>::shared_ptr
            ((shared_ptr<nuraft::peer> *)this_01,(shared_ptr<nuraft::peer> *)__x);
  peer::send_req(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2751d5);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x275200);
    iVar2 = (*peVar6->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x275230);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x275246);
      uVar3 = peer::get_id((peer *)0x27524e);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x275265);
      psVar7 = peer::get_endpoint_abi_cxx11_((peer *)0x27526d);
      uVar8 = std::__cxx11::string::c_str();
      msg_if_given_abi_cxx11_
                ((char *)local_d8,"sent join request to peer %d, %s",(ulong)uVar3,uVar8);
      (*peVar6->_vptr_logger[8])
                (peVar6,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"invite_srv_to_join_cluster",0x87,local_d8,__x,this_01,psVar7);
      std::__cxx11::string::~string(local_d8);
    }
  }
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x27539f);
  std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x2753ac);
  return;
}

Assistant:

void raft_server::invite_srv_to_join_cluster() {
    ptr<req_msg> req = cs_new<req_msg>
                       ( state_->get_term(),
                         msg_type::join_cluster_request,
                         id_,
                         srv_to_join_->get_id(),
                         0L,
                         log_store_->next_slot() - 1,
                         quick_commit_index_.load() );

    ptr<cluster_config> c_conf = get_config();
    req->log_entries().push_back
        ( cs_new<log_entry>
          ( state_->get_term(), c_conf->serialize(), log_val_type::conf ) );
    srv_to_join_->send_req(srv_to_join_, req, ex_resp_handler_);
    p_in("sent join request to peer %d, %s",
         srv_to_join_->get_id(),
         srv_to_join_->get_endpoint().c_str());
}